

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

void HTS_Question_clear(HTS_Question *question)

{
  _HTS_Pattern *p_Var1;
  HTS_Pattern *ptr;
  
  if (question->string != (char *)0x0) {
    HTS_free(question->string);
  }
  ptr = question->head;
  while (ptr != (HTS_Pattern *)0x0) {
    p_Var1 = ptr->next;
    HTS_free(ptr->string);
    HTS_free(ptr);
    ptr = p_Var1;
  }
  question->string = (char *)0x0;
  question->head = (HTS_Pattern *)0x0;
  question->next = (_HTS_Question *)0x0;
  return;
}

Assistant:

static void HTS_Question_clear(HTS_Question * question)
{
   HTS_Pattern *pattern, *next_pattern;

   if (question->string != NULL)
      HTS_free(question->string);
   for (pattern = question->head; pattern; pattern = next_pattern) {
      next_pattern = pattern->next;
      HTS_free(pattern->string);
      HTS_free(pattern);
   }
   HTS_Question_initialize(question);
}